

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O2

uint masked_sad16xh_avx2(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
                        int b_stride,uint8_t *m_ptr,int m_stride,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  auVar7[8] = 0x40;
  auVar7._0_8_ = 0x4040404040404040;
  auVar7[9] = 0x40;
  auVar7[10] = 0x40;
  auVar7[0xb] = 0x40;
  auVar7[0xc] = 0x40;
  auVar7[0xd] = 0x40;
  auVar7[0xe] = 0x40;
  auVar7[0xf] = 0x40;
  auVar7[0x10] = 0x40;
  auVar7[0x11] = 0x40;
  auVar7[0x12] = 0x40;
  auVar7[0x13] = 0x40;
  auVar7[0x14] = 0x40;
  auVar7[0x15] = 0x40;
  auVar7[0x16] = 0x40;
  auVar7[0x17] = 0x40;
  auVar7[0x18] = 0x40;
  auVar7[0x19] = 0x40;
  auVar7[0x1a] = 0x40;
  auVar7[0x1b] = 0x40;
  auVar7[0x1c] = 0x40;
  auVar7[0x1d] = 0x40;
  auVar7[0x1e] = 0x40;
  auVar7[0x1f] = 0x40;
  auVar8._8_2_ = 0x200;
  auVar8._0_8_ = 0x200020002000200;
  auVar8._10_2_ = 0x200;
  auVar8._12_2_ = 0x200;
  auVar8._14_2_ = 0x200;
  auVar8._16_2_ = 0x200;
  auVar8._18_2_ = 0x200;
  auVar8._20_2_ = 0x200;
  auVar8._22_2_ = 0x200;
  auVar8._24_2_ = 0x200;
  auVar8._26_2_ = 0x200;
  auVar8._28_2_ = 0x200;
  auVar8._30_2_ = 0x200;
  for (iVar5 = 0; iVar5 < height; iVar5 = iVar5 + 2) {
    auVar9._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src_ptr + src_stride) +
         ZEXT116(1) * *(undefined1 (*) [16])src_ptr;
    auVar9._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src_ptr + src_stride);
    auVar10._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])a_ptr + a_stride) +
         ZEXT116(1) * *(undefined1 (*) [16])a_ptr;
    auVar10._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])a_ptr + a_stride);
    auVar11._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])b_ptr + b_stride) +
         ZEXT116(1) * *(undefined1 (*) [16])b_ptr;
    auVar11._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])b_ptr + b_stride);
    auVar12._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])m_ptr + m_stride) +
         ZEXT116(1) * *(undefined1 (*) [16])m_ptr;
    auVar12._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])m_ptr + m_stride);
    auVar2 = vpsubb_avx2(auVar7,auVar12);
    auVar3 = vpunpcklbw_avx2(auVar10,auVar11);
    auVar4 = vpunpcklbw_avx2(auVar12,auVar2);
    auVar3 = vpmaddubsw_avx2(auVar3,auVar4);
    auVar4 = vpmulhrsw_avx2(auVar3,auVar8);
    auVar3 = vpunpckhbw_avx2(auVar10,auVar11);
    auVar2 = vpunpckhbw_avx2(auVar12,auVar2);
    auVar3 = vpmaddubsw_avx2(auVar3,auVar2);
    auVar3 = vpmulhrsw_avx2(auVar3,auVar8);
    auVar3 = vpackuswb_avx2(auVar4,auVar3);
    auVar3 = vpsadbw_avx2(auVar3,auVar9);
    auVar3 = vpaddd_avx2(auVar6._0_32_,auVar3);
    auVar6 = ZEXT3264(auVar3);
    src_ptr = *(undefined1 (*) [16])src_ptr + src_stride * 2;
    a_ptr = *(undefined1 (*) [16])a_ptr + a_stride * 2;
    b_ptr = *(undefined1 (*) [16])b_ptr + b_stride * 2;
    m_ptr = *(undefined1 (*) [16])m_ptr + m_stride * 2;
  }
  auVar7 = vpshufd_avx2(auVar6._0_32_,0xd8);
  auVar7 = vpermq_avx2(auVar7,0xd8);
  auVar1 = vphaddd_avx(auVar7._0_16_,auVar7._0_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  return auVar1._0_4_;
}

Assistant:

static inline unsigned int masked_sad16xh_avx2(
    const uint8_t *src_ptr, int src_stride, const uint8_t *a_ptr, int a_stride,
    const uint8_t *b_ptr, int b_stride, const uint8_t *m_ptr, int m_stride,
    int height) {
  int y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_scale =
      _mm256_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  for (y = 0; y < height; y += 2) {
    const __m256i src = yy_loadu2_128(src_ptr + src_stride, src_ptr);
    const __m256i a = yy_loadu2_128(a_ptr + a_stride, a_ptr);
    const __m256i b = yy_loadu2_128(b_ptr + b_stride, b_ptr);
    const __m256i m = yy_loadu2_128(m_ptr + m_stride, m_ptr);
    const __m256i m_inv = _mm256_sub_epi8(mask_max, m);

    // Calculate 16 predicted pixels.
    // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
    // is 64 * 255, so we have plenty of space to add rounding constants.
    const __m256i data_l = _mm256_unpacklo_epi8(a, b);
    const __m256i mask_l = _mm256_unpacklo_epi8(m, m_inv);
    __m256i pred_l = _mm256_maddubs_epi16(data_l, mask_l);
    pred_l = _mm256_mulhrs_epi16(pred_l, round_scale);

    const __m256i data_r = _mm256_unpackhi_epi8(a, b);
    const __m256i mask_r = _mm256_unpackhi_epi8(m, m_inv);
    __m256i pred_r = _mm256_maddubs_epi16(data_r, mask_r);
    pred_r = _mm256_mulhrs_epi16(pred_r, round_scale);

    const __m256i pred = _mm256_packus_epi16(pred_l, pred_r);
    res = _mm256_add_epi32(res, _mm256_sad_epu8(pred, src));

    src_ptr += src_stride << 1;
    a_ptr += a_stride << 1;
    b_ptr += b_stride << 1;
    m_ptr += m_stride << 1;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  res = _mm256_shuffle_epi32(res, 0xd8);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int32_t sad = _mm256_extract_epi32(res, 0);
  return sad;
}